

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O1

void vkt::createGlslTests(TestCaseGroup *glslTests)

{
  char *__s;
  TestCaseGroup *node;
  TestNode *this;
  TestContext *testCtx;
  long *plVar1;
  TestNode *pTVar2;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  allocator<char> local_f2;
  allocator<char> local_f1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_f0;
  TestNode *local_e0;
  TestContext *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  local_d8 = (glslTests->super_TestNode).m_testCtx;
  lVar5 = 8;
  local_e0 = &glslTests->super_TestNode;
  do {
    __s = *(char **)((long)&createGlslTests::s_es310Tests[0].name + lVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)(&UNK_00d1afb8 + lVar5),&local_f1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_f2);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"vulkan/glsl/es310/","");
    plVar1 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0 = &local_c0;
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_c0 = *plVar3;
      lStack_b8 = plVar1[3];
    }
    else {
      local_c0 = *plVar3;
      local_d0 = (long *)*plVar1;
    }
    local_c8 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar4 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_b0.field_2._M_allocated_capacity = *psVar4;
      local_b0.field_2._8_8_ = plVar1[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar4;
      local_b0._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_b0._M_string_length = plVar1[1];
    *plVar1 = (long)psVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    createShaderLibraryGroup(&local_f0,local_d8,&local_70,&local_50,&local_b0);
    node = local_f0.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
    local_f0.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild(local_e0,&node->super_TestNode);
    if (&(local_f0.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data.ptr)->super_TestNode != (TestNode *)0x0) {
      (*((local_f0.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data.ptr)->super_TestNode)._vptr_TestNode[1])();
      local_f0.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
      ptr = (TestCaseGroup *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    testCtx = local_d8;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x98);
  pTVar2 = &sr::createDerivateTests(local_d8)->super_TestNode;
  this = local_e0;
  tcu::TestNode::addChild(local_e0,pTVar2);
  pTVar2 = &sr::createDiscardTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createIndexingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createLoopTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createMatrixTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createOperatorTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createReturnTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createStructTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createSwitchTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createTextureFunctionTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createTextureGatherTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &sr::createBuiltinVarTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &shaderexecutor::createBuiltinTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = &shaderexecutor::createOpaqueTypeIndexingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar2);
  return;
}

Assistant:

void createGlslTests (tcu::TestCaseGroup* glslTests)
{
	tcu::TestContext&	testCtx		= glslTests->getTestContext();

	// ShaderLibrary-based tests
	static const struct
	{
		const char*		name;
		const char*		description;
	} s_es310Tests[] =
	{
		{ "arrays",						"Arrays"					},
		{ "conditionals",				"Conditional statements"	},
		{ "constant_expressions",		"Constant expressions"		},
		{ "constants",					"Constants"					},
		{ "conversions",				"Type conversions"			},
		{ "functions",					"Functions"					},
		{ "linkage",					"Linking"					},
		{ "scoping",					"Scoping"					},
		{ "swizzles",					"Swizzles"					},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_es310Tests); ndx++)
		glslTests->addChild(createShaderLibraryGroup(testCtx,
													 s_es310Tests[ndx].name,
													 s_es310Tests[ndx].description,
													 std::string("vulkan/glsl/es310/") + s_es310Tests[ndx].name + ".test").release());

	// ShaderRenderCase-based tests
	glslTests->addChild(sr::createDerivateTests			(testCtx));
	glslTests->addChild(sr::createDiscardTests			(testCtx));
	glslTests->addChild(sr::createIndexingTests			(testCtx));
	glslTests->addChild(sr::createLoopTests				(testCtx));
	glslTests->addChild(sr::createMatrixTests			(testCtx));
	glslTests->addChild(sr::createOperatorTests			(testCtx));
	glslTests->addChild(sr::createReturnTests			(testCtx));
	glslTests->addChild(sr::createStructTests			(testCtx));
	glslTests->addChild(sr::createSwitchTests			(testCtx));
	glslTests->addChild(sr::createTextureFunctionTests	(testCtx));
	glslTests->addChild(sr::createTextureGatherTests	(testCtx));
	glslTests->addChild(sr::createBuiltinVarTests		(testCtx));

	// ShaderExecutor-based tests
	glslTests->addChild(shaderexecutor::createBuiltinTests				(testCtx));
	glslTests->addChild(shaderexecutor::createOpaqueTypeIndexingTests	(testCtx));
}